

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O2

int db_upvaluejoin(lua_State *L)

{
  int iVar1;
  undefined8 in_RAX;
  int n2;
  int n1;
  
  _n2 = in_RAX;
  checkupval(L,1,2,&n1);
  checkupval(L,3,4,&n2);
  iVar1 = lua_iscfunction(L,1);
  if (iVar1 != 0) {
    luaL_argerror(L,1,"Lua function expected");
  }
  iVar1 = lua_iscfunction(L,3);
  if (iVar1 != 0) {
    luaL_argerror(L,3,"Lua function expected");
  }
  lua_upvaluejoin(L,1,n1,3,n2);
  return 0;
}

Assistant:

static int db_upvaluejoin (lua_State *L) {
  int n1, n2;
  checkupval(L, 1, 2, &n1);
  checkupval(L, 3, 4, &n2);
  luaL_argcheck(L, !lua_iscfunction(L, 1), 1, "Lua function expected");
  luaL_argcheck(L, !lua_iscfunction(L, 3), 3, "Lua function expected");
  lua_upvaluejoin(L, 1, n1, 3, n2);
  return 0;
}